

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  bool bVar1;
  int iVar2;
  CppType CVar3;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar5;
  Arena *pAVar6;
  Arena *pAVar7;
  LogFinisher local_81;
  Arena *local_80;
  ExtensionSet *local_78;
  LogMessage local_70;
  Extension *extension;
  undefined4 extraout_var_00;
  
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
    return;
  }
  iVar2 = (*message->_vptr_MessageLite[5])(message);
  local_80 = (Arena *)CONCAT44(extraout_var,iVar2);
  local_78 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,&extension);
  if (bVar1) {
    extension->type = type;
    CVar3 = anon_unknown_29::cpp_type(type);
    pAVar7 = local_80;
    if (CVar3 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x25b);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_81,pLVar4);
      pAVar7 = local_80;
      LogMessage::~LogMessage(&local_70);
    }
    extension->is_repeated = false;
    extension->field_0xa = extension->field_0xa & 0xf;
LAB_0033c436:
    pAVar6 = local_78->arena_;
  }
  else {
    pAVar7 = local_80;
    if (extension->is_repeated != false) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x268);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=(&local_81,pLVar4);
      pAVar7 = local_80;
      LogMessage::~LogMessage(&local_70);
    }
    CVar3 = anon_unknown_29::cpp_type(extension->type);
    if (CVar3 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x268);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_81,pLVar4);
      LogMessage::~LogMessage(&local_70);
    }
    if ((extension->field_0xa & 0x10) != 0) {
      (**(code **)((((extension->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_
                  + 0x28))((extension->field_0).repeated_string_value,message);
      goto LAB_0033c4f8;
    }
    pAVar6 = local_78->arena_;
    if (pAVar6 == (Arena *)0x0) {
      if ((extension->field_0).repeated_string_value !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0) {
        (**(code **)((((extension->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
                     arena_ + 8))();
        goto LAB_0033c436;
      }
      pAVar6 = (Arena *)0x0;
    }
  }
  if (pAVar7 == pAVar6) {
    (extension->field_0).message_value = message;
  }
  else if (pAVar7 == (Arena *)0x0) {
    (extension->field_0).message_value = message;
    Arena::Own<google::protobuf::MessageLite>(local_78->arena_,message);
  }
  else {
    iVar2 = (*message->_vptr_MessageLite[4])(message);
    pRVar5 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(extraout_var_00,iVar2);
    (extension->field_0).repeated_string_value = pRVar5;
    (**(code **)((pRVar5->super_RepeatedPtrFieldBase).arena_ + 0x50))(pRVar5,message);
  }
LAB_0033c4f8:
  extension->field_0xa = extension->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == NULL) {
    ClearExtension(number);
    return;
  }
  ::google::protobuf::Arena* message_arena = message->GetArena();
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    if (message_arena == arena_) {
      extension->message_value = message;
    } else if (message_arena == NULL) {
      extension->message_value = message;
      arena_->Own(message);  // not NULL because not equal to message_arena
    } else {
      extension->message_value = message->New(arena_);
      extension->message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->SetAllocatedMessage(message);
    } else {
      if (arena_ == NULL) {
        delete extension->message_value;
      }
      if (message_arena == arena_) {
        extension->message_value = message;
      } else if (message_arena == NULL) {
        extension->message_value = message;
        arena_->Own(message);  // not NULL because not equal to message_arena
      } else {
        extension->message_value = message->New(arena_);
        extension->message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}